

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
dynamic_xpression<boost::xpressive::detail::mark_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::repeat_(void *param_1,undefined8 param_2,
         sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *param_3)

{
  quant_enum qVar1;
  source_location *this;
  error_type in_stack_ffffffffffffff7c;
  regex_error *in_stack_ffffffffffffff80;
  source_location local_78 [3];
  sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_20;
  undefined8 local_18;
  void *local_10;
  
  local_20 = param_3;
  local_18 = param_2;
  local_10 = param_1;
  qVar1 = sequence<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::quant(param_3);
  if (qVar1 == quant_none) {
    regex_error::regex_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,(char *)param_1);
    this = local_78;
    source_location::source_location
              (this,
               "/workspace/llm4binary/github/license_c_cmakelists/InsightSoftwareConsortium[P]ITK/build_O0/KWStyle/Utilities/boost/xpressive/detail/dynamic/dynamic.hpp"
               ,0x76,
               "void boost::xpressive::detail::dynamic_xpression<boost::xpressive::detail::mark_end_matcher, __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>>::repeat_(const quant_spec &, sequence<BidiIter> &, mpl::int_<quant_none>, mpl::false_) const [Matcher = boost::xpressive::detail::mark_end_matcher, BidiIter = __gnu_cxx::__normal_iterator<const char *, std::basic_string<char>>]"
               ,0);
    throw_exception<boost::xpressive::regex_error>((regex_error *)param_1,this);
  }
  repeat_((dynamic_xpression<boost::xpressive::detail::mark_end_matcher,___gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)param_1,local_18,local_20);
  return;
}

Assistant:

void repeat_(quant_spec const &spec, sequence<BidiIter> &seq, mpl::int_<quant_none>, mpl::false_) const
    {
        if(quant_none == seq.quant())
        {
            BOOST_THROW_EXCEPTION(
                regex_error(regex_constants::error_badrepeat, "expression cannot be quantified")
            );
        }
        else
        {
            this->repeat_(spec, seq, mpl::int_<quant_variable_width>(), mpl::false_());
        }
    }